

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_setuservalue(lua_State *L)

{
  TValue *L_00;
  lua_State *in_RDI;
  TValue *o;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  L_00 = in_RDI->base;
  if ((in_RDI->top <= L_00) || ((L_00->field_2).it != 0xfffffff3)) {
    lj_err_argt((lua_State *)&L_00->field_2,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  }
  if ((L_00 + 1 < in_RDI->top) && (((GCRef *)((long)L_00 + 0xc))->gcptr32 == 0xfffffff4)) {
    in_RDI->top = L_00 + 2;
    lua_setfenv(in_RDI,(int)((ulong)L_00 >> 0x20));
    return 1;
  }
  lj_err_argt((lua_State *)&L_00->field_2,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
}

Assistant:

LJLIB_CF(debug_setuservalue)
{
  TValue *o = L->base;
  if (!(o < L->top && tvisudata(o)))
    lj_err_argt(L, 1, LUA_TUSERDATA);
  if (!(o+1 < L->top && tvistab(o+1)))
    lj_err_argt(L, 2, LUA_TTABLE);
  L->top = o+2;
  lua_setfenv(L, 1);
  return 1;
}